

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.h
# Opt level: O0

void __thiscall cmGeneratorTarget::ImportInfo::ImportInfo(ImportInfo *this,ImportInfo *param_1)

{
  undefined3 uVar1;
  uint uVar2;
  ImportInfo *param_1_local;
  ImportInfo *this_local;
  
  uVar1 = *(undefined3 *)&param_1->field_0x1;
  uVar2 = param_1->Multiplicity;
  this->NoSOName = param_1->NoSOName;
  *(undefined3 *)&this->field_0x1 = uVar1;
  this->Multiplicity = uVar2;
  std::__cxx11::string::string((string *)&this->Location,(string *)&param_1->Location);
  std::__cxx11::string::string((string *)&this->SOName,(string *)&param_1->SOName);
  std::__cxx11::string::string((string *)&this->ImportLibrary,(string *)&param_1->ImportLibrary);
  std::__cxx11::string::string((string *)&this->LibName,(string *)&param_1->LibName);
  std::__cxx11::string::string((string *)&this->Languages,(string *)&param_1->Languages);
  std::__cxx11::string::string((string *)&this->Libraries,(string *)&param_1->Libraries);
  std::__cxx11::string::string((string *)&this->LibrariesProp,(string *)&param_1->LibrariesProp);
  std::__cxx11::string::string((string *)&this->SharedDeps,(string *)&param_1->SharedDeps);
  return;
}

Assistant:

ImportInfo()
      : NoSOName(false)
      , Multiplicity(0)
    {
    }